

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H22_radix_sort.c
# Opt level: O1

void sort(uint *A,uint *B,int n)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  int C [64];
  int local_138 [66];
  
  uVar5 = (ulong)(uint)n;
  uVar7 = 0;
  do {
    memset(local_138,0,0x100);
    if (0 < n) {
      uVar2 = 0;
      do {
        local_138[A[uVar2] >> ((byte)uVar7 & 0x1f) & 0x3f] =
             local_138[A[uVar2] >> ((byte)uVar7 & 0x1f) & 0x3f] + 1;
        uVar2 = uVar2 + 1;
      } while (uVar5 != uVar2);
    }
    lVar3 = 1;
    iVar4 = local_138[0];
    do {
      iVar4 = iVar4 + local_138[lVar3];
      local_138[lVar3] = iVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    lVar3 = uVar5 + 1;
    if (0 < n) {
      do {
        uVar1 = A[lVar3 + -2];
        uVar6 = uVar1 >> ((byte)uVar7 & 0x1f) & 0x3f;
        iVar4 = local_138[uVar6];
        local_138[uVar6] = iVar4 + -1;
        B[(long)iVar4 + -1] = uVar1;
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    if (0 < n) {
      uVar2 = 0;
      do {
        A[uVar2] = B[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar5 != uVar2);
    }
    bVar8 = uVar7 < 0x1a;
    uVar7 = uVar7 + 6;
  } while (bVar8);
  return;
}

Assistant:

void sort(unsigned int A[], unsigned int B[], int n) {
  int i, bit;
  int C[M];

  for (bit = 0; bit < 32; bit += 6) {
    for (i = 0; i < M; ++i) {
      C[i] = 0;
    }
    for (i = 0; i < n; ++i) {
      ++C[(A[i] >> bit) & MASK];
    }

    for (i = 1; i < M; ++i) {
      C[i] += C[i - 1];
    }

    for (i = n - 1; i >= 0; --i) {
      B[--C[(A[i] >> bit) & MASK]] = A[i];
    }

    for (i = 0; i < n; i++) {
      A[i] = B[i];
    }
  }
}